

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int seal_template_obj(JSContext *ctx,JSValue obj)

{
  JSShape *pJVar1;
  uint uVar2;
  JSValueUnion p;
  JSShapeProperty *prs;
  JSShapeProperty *local_10;
  
  p = obj.u;
  pJVar1 = *(JSShape **)((long)p.ptr + 0x18);
  uVar2 = (&(pJVar1->header).ref_count)[(int)(~pJVar1->prop_hash_mask | 0xffffffcf)];
  if (uVar2 != 0) {
    pJVar1 = pJVar1 + 1;
    do {
      local_10 = (JSShapeProperty *)((long)pJVar1 + (ulong)uVar2 * 8 + -8);
      if (*(int *)((long)pJVar1 + (ulong)uVar2 * 8 + -4) == 0x30) {
        if (local_10 != (JSShapeProperty *)0x0) {
          uVar2 = js_update_property_flags
                            (ctx,(JSObject *)p.ptr,&local_10,*(uint *)local_10 >> 0x1a & 0xfffffffc)
          ;
          pJVar1 = (JSShape *)(ulong)uVar2;
          if (uVar2 != 0) {
            return uVar2;
          }
        }
        break;
      }
      uVar2 = *(uint *)local_10 & 0x3ffffff;
    } while (uVar2 != 0);
  }
  *(byte *)((long)p.ptr + 5) = *(byte *)((long)p.ptr + 5) & 0xfe;
  return (int)pJVar1;
}

Assistant:

static int seal_template_obj(JSContext *ctx, JSValueConst obj)
{
    JSObject *p;
    JSShapeProperty *prs;

    p = JS_VALUE_GET_OBJ(obj);
    prs = find_own_property1(p, JS_ATOM_length);
    if (prs) {
        if (js_update_property_flags(ctx, p, &prs,
                                     prs->flags & ~(JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)))
            return -1;
    }
    p->extensible = FALSE;
    return 0;
}